

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool google::protobuf::anon_unknown_1::RetrieveOptions
               (int depth,Message *options,DescriptorPool *pool,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *option_entries)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Descriptor *type;
  Message *pMVar3;
  MessageLite *this;
  LogMessage *pLVar4;
  undefined4 extraout_var_02;
  MessageLite *options_00;
  LogFinisher local_a9;
  LogMessage local_a8;
  DynamicMessageFactory factory;
  undefined4 extraout_var_01;
  
  iVar2 = (*(options->super_MessageLite)._vptr_MessageLite[0x15])(options);
  if (*(DescriptorPool **)(*(long *)(CONCAT44(extraout_var,iVar2) + 0x10) + 0x10) != pool) {
    iVar2 = (*(options->super_MessageLite)._vptr_MessageLite[0x15])(options);
    type = DescriptorPool::FindMessageTypeByName
                     (pool,*(string **)(CONCAT44(extraout_var_00,iVar2) + 8));
    if (type != (Descriptor *)0x0) {
      DynamicMessageFactory::DynamicMessageFactory(&factory);
      pMVar3 = DynamicMessageFactory::GetPrototype(&factory,type);
      iVar2 = (*(pMVar3->super_MessageLite)._vptr_MessageLite[3])(pMVar3);
      this = (MessageLite *)CONCAT44(extraout_var_01,iVar2);
      MessageLite::SerializeAsString_abi_cxx11_((string *)&local_a8,&options->super_MessageLite);
      bVar1 = MessageLite::ParseFromString(this,(string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      options_00 = this;
      if (!bVar1) {
        internal::LogMessage::LogMessage
                  (&local_a8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/descriptor.cc"
                   ,0x8fc);
        pLVar4 = internal::LogMessage::operator<<(&local_a8,"Found invalid proto option data for: ")
        ;
        iVar2 = (*(options->super_MessageLite)._vptr_MessageLite[0x15])(options);
        pLVar4 = internal::LogMessage::operator<<
                           (pLVar4,*(string **)(CONCAT44(extraout_var_02,iVar2) + 8));
        internal::LogFinisher::operator=(&local_a9,pLVar4);
        internal::LogMessage::~LogMessage(&local_a8);
        options_00 = &options->super_MessageLite;
      }
      bVar1 = RetrieveOptionsAssumingRightPool(depth,(Message *)options_00,option_entries);
      (*this->_vptr_MessageLite[1])(this);
      DynamicMessageFactory::~DynamicMessageFactory(&factory);
      return bVar1;
    }
  }
  bVar1 = RetrieveOptionsAssumingRightPool(depth,options,option_entries);
  return bVar1;
}

Assistant:

bool RetrieveOptions(int depth, const Message& options,
                     const DescriptorPool* pool,
                     std::vector<std::string>* option_entries) {
  // When printing custom options for a descriptor, we must use an options
  // message built on top of the same DescriptorPool where the descriptor
  // is coming from. This is to ensure we are interpreting custom options
  // against the right pool.
  if (options.GetDescriptor()->file()->pool() == pool) {
    return RetrieveOptionsAssumingRightPool(depth, options, option_entries);
  } else {
    const Descriptor* option_descriptor =
        pool->FindMessageTypeByName(options.GetDescriptor()->full_name());
    if (option_descriptor == nullptr) {
      // descriptor.proto is not in the pool. This means no custom options are
      // used so we are safe to proceed with the compiled options message type.
      return RetrieveOptionsAssumingRightPool(depth, options, option_entries);
    }
    DynamicMessageFactory factory;
    std::unique_ptr<Message> dynamic_options(
        factory.GetPrototype(option_descriptor)->New());
    if (dynamic_options->ParseFromString(options.SerializeAsString())) {
      return RetrieveOptionsAssumingRightPool(depth, *dynamic_options,
                                              option_entries);
    } else {
      GOOGLE_LOG(ERROR) << "Found invalid proto option data for: "
                 << options.GetDescriptor()->full_name();
      return RetrieveOptionsAssumingRightPool(depth, options, option_entries);
    }
  }
}